

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogToSinks
          (log_internal *this,LogEntry *entry,Span<absl::lts_20250127::LogSink_*> extra_sinks,
          bool extra_sinks_only)

{
  size_type sVar1;
  long in_FS_OFFSET;
  string_view message;
  Span<absl::lts_20250127::LogSink_*> sinks;
  Span<absl::lts_20250127::LogSink_*> sinks_00;
  ReaderMutexLock local_28;
  
  sVar1 = extra_sinks.len_;
  sinks.ptr_ = extra_sinks.ptr_;
  anon_unknown_0::GlobalSinks();
  sinks.len_ = sVar1;
  anon_unknown_0::GlobalLogSinkSet::SendToSinks((GlobalLogSinkSet *)this,entry,sinks);
  if ((int)extra_sinks.len_ == 0) {
    if (*(char *)(in_FS_OFFSET + -0x20) == '\x01') {
      message._M_len = *(long *)(this + 0x48) - 1;
      message._M_str = *(char **)(this + 0x40);
      WriteToStderr(message,*(LogSeverity *)(this + 0x28));
      return;
    }
    local_28.mu_ = (Mutex *)&anon_unknown_0::GlobalSinks::global_sinks;
    Mutex::ReaderLock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
    *(undefined1 *)(in_FS_OFFSET + -0x20) = 1;
    sinks_00.ptr_ =
         (pointer)((long)(anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_ -
                         anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_) >> 3);
    sinks_00.len_ = sVar1;
    anon_unknown_0::GlobalLogSinkSet::SendToSinks
              ((GlobalLogSinkSet *)this,
               (LogEntry *)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_,sinks_00);
    *(undefined1 *)(in_FS_OFFSET + -0x20) = 0;
    ReaderMutexLock::~ReaderMutexLock(&local_28);
  }
  return;
}

Assistant:

void LogToSinks(const absl::LogEntry& entry,
                absl::Span<absl::LogSink*> extra_sinks, bool extra_sinks_only) {
  log_internal::GlobalSinks().LogToSinks(entry, extra_sinks, extra_sinks_only);
}